

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gop_structure.c
# Opt level: O0

void set_params_for_internal_arfs_in_gf14
               (GF_GROUP *gf_group,FRAME_REORDER_INFO *arf_frame_stats,int *cur_frame_idx,
               int *cur_disp_idx,int *frame_ind,int *count_arf_frames,int *doh_gf_index_map,
               int start,int end,int layer_depth,int layer_with_parallel_encodes)

{
  int display_idx;
  int *in_RCX;
  undefined4 *in_RDX;
  FRAME_REORDER_INFO *in_RSI;
  long in_RDI;
  int *in_R8;
  int *in_R9;
  int index;
  
  display_idx = ((int)frame_ind + (int)cur_disp_idx + -1) / 2;
  *(undefined1 *)(in_RDI + *in_R8) = 6;
  *(char *)(in_RDI + 0xfa + (long)*in_R8) = (char)display_idx + -1;
  *(char *)(in_RDI + 500 + (long)*in_R8) = (char)*in_RDX;
  *(int *)(in_RDI + 0x2f0 + (long)*in_R8 * 4) = (int)cur_frame_idx;
  *(undefined1 *)(in_RDI + 0x1680 + (long)*in_R8) = 1;
  *(undefined1 *)(in_RDI + 0x177a + (long)*in_R8) = 1;
  *(uint *)(in_RDI + 0x1c64 + (long)*in_R8 * 4) =
       *in_RCX + (uint)*(byte *)(in_RDI + 0xfa + (long)*in_R8);
  count_arf_frames[display_idx] = *in_R8;
  if ((int)arf_frame_stats != 0) {
    if (*(int *)(in_RDI + 0x2f0 + (long)(*in_R8 + -1) * 4) == (int)cur_frame_idx) {
      *(undefined4 *)(in_RDI + 0x2fec + (long)*in_R8 * 4) = 2;
      *(undefined4 *)(in_RDI + 0x5508 + (long)*in_R8 * 4) =
           *(undefined4 *)(in_RDI + 0x1c64 + (long)(*in_R8 + -1) * 4);
    }
    else {
      *(undefined4 *)(in_RDI + 0x2fec + (long)*in_R8 * 4) = 1;
    }
  }
  *in_R8 = *in_R8 + 1;
  fill_arf_frame_stats(in_RSI,*in_R9,display_idx,(int)frame_ind,(int)cur_disp_idx);
  *in_R9 = *in_R9 + 1;
  return;
}

Assistant:

static inline void set_params_for_internal_arfs_in_gf14(
    GF_GROUP *const gf_group, FRAME_REORDER_INFO *arf_frame_stats,
    int *cur_frame_idx, int *cur_disp_idx, int *frame_ind,
    int *count_arf_frames, int *doh_gf_index_map, int start, int end,
    int layer_depth, int layer_with_parallel_encodes) {
  int index = (start + end - 1) / 2;
  gf_group->update_type[*frame_ind] = INTNL_ARF_UPDATE;
  gf_group->arf_src_offset[*frame_ind] = index - 1;
  gf_group->cur_frame_idx[*frame_ind] = *cur_frame_idx;
  gf_group->layer_depth[*frame_ind] = layer_depth;
  gf_group->frame_type[*frame_ind] = INTER_FRAME;
  gf_group->refbuf_state[*frame_ind] = REFBUF_UPDATE;
  gf_group->display_idx[*frame_ind] =
      (*cur_disp_idx) + gf_group->arf_src_offset[*frame_ind];

  // Update the display index of the current frame with its gf index.
  doh_gf_index_map[index] = *frame_ind;
  if (layer_with_parallel_encodes) {
    assert(layer_depth == 4);
    // Set frame_parallel_level of the first frame in the given layer depth
    // to 1.
    if (gf_group->layer_depth[(*frame_ind) - 1] != layer_depth) {
      gf_group->frame_parallel_level[*frame_ind] = 1;
    } else {
      // Set frame_parallel_level of the consecutive frame in the same given
      // layer depth to 2.
      assert(gf_group->frame_parallel_level[(*frame_ind) - 1] == 1);
      gf_group->frame_parallel_level[*frame_ind] = 2;
      // Set the display_idx of frame_parallel_level 1 frame in
      // gf_group->skip_frame_as_ref.
      gf_group->skip_frame_as_ref[*frame_ind] =
          gf_group->display_idx[(*frame_ind) - 1];
    }
  }
  ++(*frame_ind);

  // Update arf_frame_stats.
  fill_arf_frame_stats(arf_frame_stats, *count_arf_frames, index, start, end);
  ++(*count_arf_frames);
}